

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

int sat_solver2_check_watched(sat_solver2 *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  veci *pvVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int claSat [2];
  int local_38 [2];
  
  local_38[0] = 0;
  local_38[1] = 0;
  if (0 < s->size) {
    pvVar4 = s->wlists;
    lVar10 = 0;
    do {
      iVar8 = pvVar4[lVar10].size;
      iVar12 = 0;
      if (0 < iVar8) {
        piVar5 = pvVar4[lVar10].ptr;
        lVar13 = 0;
        iVar12 = 0;
        do {
          uVar1 = piVar5[lVar13];
          uVar7 = (s->Mem).uPageMask & uVar1;
          if (uVar7 == 0) {
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          piVar6 = (s->Mem).pPages[(int)uVar1 >> ((byte)(s->Mem).nPageSize & 0x1f)];
          uVar2 = piVar6[(int)uVar7];
          uVar11 = uVar2 >> 0xb;
          uVar15 = 0;
          if (0x7ff < uVar2) {
            uVar14 = 0;
            do {
              uVar3 = piVar6[(long)(int)uVar7 + uVar14 + 1];
              uVar15 = uVar14;
              if ((uVar3 & 1) == (int)s->assigns[(int)uVar3 >> 1]) break;
              uVar14 = uVar14 + 1;
              uVar15 = (ulong)uVar11;
            } while (uVar11 != uVar14);
          }
          if ((uint)uVar15 == uVar11) {
            lVar9 = (long)iVar12;
            iVar12 = iVar12 + 1;
            piVar5[lVar9] = uVar1;
          }
          else {
            local_38[uVar2 & 1] = local_38[uVar2 & 1] + 1;
          }
          lVar13 = lVar13 + 1;
          iVar8 = pvVar4[lVar10].size;
        } while (lVar13 < iVar8);
      }
      if (iVar8 < iVar12) {
        __assert_fail("k <= v->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                      ,0x30,"void veci_resize(veci *, int)");
      }
      pvVar4[lVar10].size = iVar12;
      lVar10 = lVar10 + 1;
    } while (SBORROW8(lVar10,(long)s->size * 2) != lVar10 + (long)s->size * -2 < 0);
  }
  return 0;
}

Assistant:

int sat_solver2_check_watched( sat_solver2* s )
{
    clause * c;
    int i, k, j, m;
    int claSat[2] = {0};
    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( m = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            c = clause2_read(s, pArray[k]);
            for ( j = 0; j < (int)c->size; j++ )
                if ( var_value(s, lit_var(c->lits[j])) == lit_sign(c->lits[j]) ) // true lit
                    break;
            if ( j == (int)c->size )
            {
                pArray[m++] = pArray[k];
                continue;
            }
            claSat[c->lrn]++;
        }
        veci_resize(&s->wlists[i],m);
        if ( m == 0 )
        {
//            s->wlists[i].cap = 0;
//            s->wlists[i].size = 0;
//            ABC_FREE( s->wlists[i].ptr );
        }
    }
//    printf( "\nClauses = %d  (Sat = %d).  Learned = %d  (Sat = %d).\n",
//        s->stats.clauses, claSat[0], s->stats.learnts, claSat[1] );
    return 0;
}